

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O2

File * File::parse_file_binary(File *__return_storage_ptr__,ifstream *in)

{
  variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
  *this;
  pointer puVar1;
  u2 uVar2;
  u2 uVar3;
  u4 uVar4;
  u4 uVar5;
  variant_alternative_t<0UL,_variant<basic_string<char>,_int,_double>_> *__lhs;
  InvalidFile *pIVar6;
  byte bVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  short sVar11;
  uint uVar12;
  bool bVar13;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  Instruction IVar14;
  size_t pos;
  Instruction local_278;
  vector<vm::Instruction,_std::allocator<vm::Instruction>_> start;
  vector<vm::Function,_std::allocator<vm::Function>_> functions;
  vector<vm::Constant,_std::allocator<vm::Constant>_> constants;
  Constant constant;
  size_type bufferSize;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  anon_class_24_3_d3a0271c read2bytes;
  anon_class_24_3_94a76bc3 readInstruction;
  vector<vm::Function,_std::allocator<vm::Function>_> local_178;
  _Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_> local_158;
  vector<vm::Constant,_std::allocator<vm::Constant>_> local_138;
  anon_class_24_3_d3a0271c read4bytes;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  anon_class_24_3_d3a0271c readByte;
  
  __first._8_8_ = 0xffffffffffffffff;
  __first._M_sbuf = *(streambuf_type **)(in + *(long *)(*(long *)in + -0x18) + 0xe8);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<std::istreambuf_iterator<char,std::char_traits<char>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&buffer,__first,
             (istreambuf_iterator<char,_std::char_traits<char>_>)(ZEXT816(0xffffffff) << 0x40),
             (allocator_type *)&constant);
  read2bytes.pos = &pos;
  pos = 0;
  bufferSize = (long)buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
  read2bytes.bufferSize = &bufferSize;
  readInstruction.readByte = &readByte;
  readInstruction.read2bytes = &read2bytes;
  readInstruction.read4bytes = &read4bytes;
  read2bytes.buffer = &buffer;
  read4bytes.pos = read2bytes.pos;
  read4bytes.bufferSize = read2bytes.bufferSize;
  read4bytes.buffer = &buffer;
  readByte.pos = read2bytes.pos;
  readByte.bufferSize = read2bytes.bufferSize;
  readByte.buffer = &buffer;
  uVar4 = parse_file_binary::anon_class_24_3_d3a0271c::operator()(readInstruction.read4bytes);
  if (uVar4 != 0x43303a29) {
    pIVar6 = (InvalidFile *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"invalid binary file: invalid magic",(allocator<char> *)&constant
              );
    InvalidFile::InvalidFile(pIVar6,&local_68);
    __cxa_throw(pIVar6,&InvalidFile::typeinfo,InvalidFile::~InvalidFile);
  }
  uVar4 = parse_file_binary::anon_class_24_3_d3a0271c::operator()(&read4bytes);
  uVar2 = parse_file_binary::anon_class_24_3_d3a0271c::operator()(&read2bytes);
  constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this = &constant.value;
  uVar12 = 0;
  do {
    if (uVar12 == uVar2) {
      uVar2 = parse_file_binary::anon_class_24_3_d3a0271c::operator()(&read2bytes);
      start.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      start.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      start.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      uVar12 = (uint)uVar2;
      while (bVar13 = uVar12 != 0, uVar12 = uVar12 - 1, bVar13) {
        IVar14 = parse_file_binary::anon_class_24_3_94a76bc3::operator()(&readInstruction);
        constant.type = IVar14.op;
        constant._1_1_ = IVar14._1_1_;
        constant._2_2_ = IVar14._2_2_;
        constant._4_2_ = IVar14.x._0_2_;
        constant._6_2_ = IVar14.x._2_2_;
        constant.value.
        super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
        .super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double>.
        super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double>.
        super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>.
        super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>.
        super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double>._M_u._M_rest.
        _0_4_ = (undefined4)IVar14.y;
        std::vector<vm::Instruction,_std::allocator<vm::Instruction>_>::
        emplace_back<vm::Instruction>(&start,(Instruction *)&constant);
      }
      uVar2 = parse_file_binary::anon_class_24_3_d3a0271c::operator()(&read2bytes);
      functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar7 = 0;
      uVar12 = 0;
      while( true ) {
        if (uVar12 == uVar2) {
          if (bVar7 == 0) {
            pIVar6 = (InvalidFile *)__cxa_allocate_exception(0x28);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_e8,"invalid binary file: main() not found",
                       (allocator<char> *)&constant);
            InvalidFile::InvalidFile(pIVar6,&local_e8);
            __cxa_throw(pIVar6,&InvalidFile::typeinfo,InvalidFile::~InvalidFile);
          }
          if (pos == (long)buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start) {
            local_138.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
            super__Vector_impl_data._M_start =
                 constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_138.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            local_138.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_158._M_impl.super__Vector_impl_data._M_start =
                 start.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl
                 .super__Vector_impl_data._M_start;
            local_158._M_impl.super__Vector_impl_data._M_finish =
                 start.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl
                 .super__Vector_impl_data._M_finish;
            local_158._M_impl.super__Vector_impl_data._M_end_of_storage =
                 start.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
            start.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            start.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            start.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_178.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
            super__Vector_impl_data._M_start =
                 functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_178.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            local_178.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            File(__return_storage_ptr__,uVar4,&local_138,
                 (vector<vm::Instruction,_std::allocator<vm::Instruction>_> *)&local_158,&local_178)
            ;
            std::vector<vm::Function,_std::allocator<vm::Function>_>::~vector(&local_178);
            std::_Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>::~_Vector_base
                      (&local_158);
            std::vector<vm::Constant,_std::allocator<vm::Constant>_>::~vector(&local_138);
            std::vector<vm::Function,_std::allocator<vm::Function>_>::~vector(&functions);
            std::_Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>::~_Vector_base
                      (&start.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>)
            ;
            std::vector<vm::Constant,_std::allocator<vm::Constant>_>::~vector(&constants);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      (&buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
            return __return_storage_ptr__;
          }
          pIVar6 = (InvalidFile *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_108,"invalid binary file: unused content",
                     (allocator<char> *)&constant);
          InvalidFile::InvalidFile(pIVar6,&local_108);
          __cxa_throw(pIVar6,&InvalidFile::typeinfo,InvalidFile::~InvalidFile);
        }
        constant.value.
        super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
        .super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double>.
        super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double>.
        super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>.
        super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>.
        super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double>._M_u._M_rest.
        _0_4_ = (undefined4)0;
        constant.value.
        super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
        .super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double>.
        super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double>.
        super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>.
        super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>.
        super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double>._M_u._4_4_ = 0;
        constant.value.
        super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
        .super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double>.
        super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double>.
        super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>.
        super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>.
        super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double>._M_u._8_8_ = 0;
        constant.value.
        super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
        .super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double>.
        super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double>.
        super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>.
        super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>.
        super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double>._M_u._16_8_ = 0;
        uVar3 = parse_file_binary::anon_class_24_3_d3a0271c::operator()(&read2bytes);
        constant.type = (Type)uVar3;
        constant._1_1_ = SUB21(uVar3 >> 8,0);
        uVar8 = (ulong)uVar3;
        lVar10 = ((long)constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>.
                       _M_impl.super__Vector_impl_data._M_start) % 0x30;
        if ((ulong)(((long)constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>.
                          _M_impl.super__Vector_impl_data._M_start) / 0x30) <= uVar8) {
          pIVar6 = (InvalidFile *)__cxa_allocate_exception(0x28,0x30,lVar10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a8,"invalid binary file: function name not found",
                     (allocator<char> *)&local_278);
          InvalidFile::InvalidFile(pIVar6,&local_a8);
          __cxa_throw(pIVar6,&InvalidFile::typeinfo,InvalidFile::~InvalidFile);
        }
        if (constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
            super__Vector_impl_data._M_start[uVar8].type != STRING) break;
        __lhs = std::get<0ul,std::__cxx11::string,int,double>
                          (&constants.
                            super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar8].value);
        bVar13 = std::operator==(__lhs,"main");
        constant._2_2_ = parse_file_binary::anon_class_24_3_d3a0271c::operator()(&read2bytes);
        constant._4_2_ = parse_file_binary::anon_class_24_3_d3a0271c::operator()(&read2bytes);
        uVar3 = parse_file_binary::anon_class_24_3_d3a0271c::operator()(&read2bytes);
        bVar7 = bVar7 | bVar13;
        uVar9 = (uint)uVar3;
        while (bVar13 = uVar9 != 0, uVar9 = uVar9 - 1, bVar13) {
          local_278 = parse_file_binary::anon_class_24_3_94a76bc3::operator()(&readInstruction);
          std::vector<vm::Instruction,_std::allocator<vm::Instruction>_>::
          emplace_back<vm::Instruction>
                    ((vector<vm::Instruction,_std::allocator<vm::Instruction>_> *)this,&local_278);
        }
        std::vector<vm::Function,_std::allocator<vm::Function>_>::emplace_back<vm::Function>
                  (&functions,(Function *)&constant);
        std::_Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>::~_Vector_base
                  ((_Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_> *)this);
        uVar12 = uVar12 + 1;
      }
      pIVar6 = (InvalidFile *)__cxa_allocate_exception(0x28,0x30,lVar10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,"invalid binary file: function name not found",
                 (allocator<char> *)&local_278);
      InvalidFile::InvalidFile(pIVar6,&local_c8);
      __cxa_throw(pIVar6,&InvalidFile::typeinfo,InvalidFile::~InvalidFile);
    }
    constant.value.
    super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
    .super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double>.
    super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double>.
    super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>.
    super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>.
    super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double>._M_u._M_rest =
         (_Variadic_union<int,_double>)
         ((long)&constant.value.
                 super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
                 .super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double>.
                 super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double>.
                 super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>.
                 super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double> + 0x10);
    constant.value.
    super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
    .super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double>.
    super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double>.
    super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>.
    super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>.
    super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double>._M_u._8_8_ = 0;
    constant.value.
    super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
    .super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double>.
    super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double>.
    super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>.
    super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>.
    super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double>._M_u._16_8_ =
         constant.value.
         super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
         .super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double>.
         super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double>.
         super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>.
         super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>.
         super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double>._M_u._16_8_ &
         0xffffffffffffff00;
    constant.value.
    super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
    .super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double>.
    super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double>.
    super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>.
    super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>.
    super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double>._M_index = '\0';
    constant.type = parse_file_binary::anon_class_24_3_d3a0271c::operator()(&readByte);
    puVar1 = buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (constant.type == STRING) {
      uVar3 = parse_file_binary::anon_class_24_3_d3a0271c::operator()(&read2bytes);
      if (bufferSize < uVar3 + pos) {
        pIVar6 = (InvalidFile *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&start,"invalid binary file: incomplete string constant",
                   (allocator<char> *)&local_278);
        InvalidFile::InvalidFile(pIVar6,(string *)&start);
        __cxa_throw(pIVar6,&InvalidFile::typeinfo,InvalidFile::~InvalidFile);
      }
      functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)&functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
      functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((ulong)functions.
                            super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
      sVar11 = uVar3 + 1;
      while (sVar11 = sVar11 + -1, sVar11 != 0) {
        pos = pos + 1;
        std::__cxx11::string::push_back
                  ((char)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &functions);
      }
      std::variant<std::__cxx11::string,int,double>::operator=
                ((variant<std::__cxx11::string,int,double> *)this,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&functions);
      std::__cxx11::string::~string((string *)&functions);
    }
    else if (constant.type == INT) {
      uVar5 = parse_file_binary::anon_class_24_3_d3a0271c::operator()(&read4bytes);
      start.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(start.
                             super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,uVar5);
      std::variant<std::__cxx11::string,int,double>::operator=
                ((variant<std::__cxx11::string,int,double> *)this,(int *)&start);
    }
    else {
      if (constant.type != DOUBLE) {
        pIVar6 = (InvalidFile *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_88,"invalid binary file: invalid constant type",
                   (allocator<char> *)&start);
        InvalidFile::InvalidFile(pIVar6,&local_88);
        __cxa_throw(pIVar6,&InvalidFile::typeinfo,InvalidFile::~InvalidFile);
      }
      if (bufferSize < pos + 8) {
        pIVar6 = (InvalidFile *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&start,"invalid binary file: incomplete double constant",
                   (allocator<char> *)&local_278);
        InvalidFile::InvalidFile(pIVar6,(string *)&start);
        __cxa_throw(pIVar6,&InvalidFile::typeinfo,InvalidFile::~InvalidFile);
      }
      uVar9 = 7;
      while( true ) {
        if ((int)uVar9 < 0) break;
        *(uchar *)((long)&start.
                          super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
                          _M_impl.super__Vector_impl_data._M_start + (ulong)uVar9) = puVar1[pos];
        uVar9 = uVar9 - 1;
        pos = pos + 1;
      }
      functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)start.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      std::variant<std::__cxx11::string,int,double>::operator=
                ((variant<std::__cxx11::string,int,double> *)this,(double *)&functions);
    }
    std::vector<vm::Constant,_std::allocator<vm::Constant>_>::emplace_back<vm::Constant>
              (&constants,&constant);
    std::__detail::__variant::
    _Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
    ::~_Variant_storage((_Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
                         *)this);
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

File File::parse_file_binary(std::ifstream& in) {
    // read raw
    const std::vector<unsigned char> buffer(std::istreambuf_iterator<char>(in), {});
    size_t pos = 0;
    const auto bufferSize = buffer.size();
    const auto readByte = [&]() {
        if (pos + 1 > bufferSize) {
            throw InvalidFile("incomplete binary file");
        }
        vm::u1 rtv = static_cast<vm::u1>(buffer[pos]);
        pos += 1;
        return rtv;
    };
    const auto read2bytes = [&] {
        if (pos + 2 > bufferSize) {
            throw InvalidFile("incomplete binary file");
        }
        vm::u2 rtv = static_cast<vm::u2>(
            (buffer[pos] << 8) | buffer[pos+1]
        );
        pos += 2;
        return rtv;
    };
    const auto read4bytes = [&]() {
        if (pos + 4 > bufferSize) {
            throw InvalidFile("incomplete binary file");
        }
        vm::u4 rtv = static_cast<vm::u4>(
            (buffer[pos] << 24) | (buffer[pos+1] << 16) | (buffer[pos+2] << 8) | buffer[pos+3]
        );
        pos += 4;
        return rtv;
    };
    const auto readDouble = [&]() {
        if (pos + 8 > bufferSize) {
            throw InvalidFile("invalid binary file: incomplete double constant");
        }
        union {
            vm::double_t d;
            unsigned char b[8];
        } rtv;
        for (int i = 7; i >= 0; --i) {
            rtv.b[i] = buffer[pos++];
        }
        return rtv.d;
    };
    const auto readString = [&](vm::u2 length) {
        if (pos + length > bufferSize) {
            throw InvalidFile("invalid binary file: incomplete string constant");
        }
        vm::str_t rtv;
        while (length-- ) {
            rtv += buffer[pos++];
        }
        return rtv;
    };
    const auto readInstruction = [&]() {
        vm::Instruction ins;
        ins.op = static_cast<vm::OpCode>(readByte());
        if (vm::nameOfOpCode.count(ins.op) == 0) {
            throw InvalidFile("invalid binary file: invalid opcode");
        }
        if (auto it = vm::paramSizeOfOpCode.find(ins.op); it != vm::paramSizeOfOpCode.end()) {
            auto paramSizes = it->second;
            switch (paramSizes[0]) {
            case 1: ins.x = readByte(); break;
            case 2: ins.x = read2bytes(); break;
            case 4: ins.x = read4bytes(); break;
            default: assert(("unexpected error", false));
            }
            if (paramSizes.size() == 2) {
                ins.y = read4bytes();
            }
        }
        return ins;
    };

    // parse magic
    auto magic = read4bytes(); 
    if (magic != magic_v) {
        throw InvalidFile("invalid binary file: invalid magic");
    }

    // parse version
    auto version = read4bytes(); 

    // parse constants
    auto constantsCount = read2bytes();
    std::vector<vm::Constant> constants;
    for (int j = 0; j < constantsCount; ++j) {
        vm::Constant constant;
        constant.type = static_cast<vm::Constant::Type>(readByte());
        switch (constant.type)
        {
        case vm::Constant::Type::STRING: {
            auto length = read2bytes();
            constant.value = std::move(readString(length));
        } break;
        case vm::Constant::Type::INT: {
            constant.value = static_cast<vm::int_t>(read4bytes());
        } break;
        case vm::Constant::Type::DOUBLE: {
            constant.value = readDouble();
        } break;
        default:
            throw InvalidFile("invalid binary file: invalid constant type");
        }
        constants.push_back(std::move(constant));
    }

    // parse start
    auto instructionsCount = read2bytes();
    std::vector<vm::Instruction> start;
    for (int j = 0; j < instructionsCount; ++j) {
        start.push_back(std::move(readInstruction()));
    }

    // parse functions
    auto functionsCount = read2bytes();
    std::vector<vm::Function> functions;
    bool mainFound = false;
    for (int j = 0; j < functionsCount; ++j) {
        vm::Function fun;
        fun.nameIndex = read2bytes();
        if (fun.nameIndex >= constants.size()) {
            throw InvalidFile("invalid binary file: function name not found");
        }
        if (constants[fun.nameIndex].type != vm::Constant::Type::STRING) {
            throw InvalidFile("invalid binary file: function name not found");
        }
        if (std::get<vm::str_t>(constants[fun.nameIndex].value) == "main") {
            mainFound = true;
        }
        fun.paramSize = read2bytes();
        fun.level = read2bytes();
        auto instructionsCount = read2bytes();
        for (int k = 0; k < instructionsCount; ++k) {
            fun.instructions.push_back(std::move(readInstruction()));
        }
        functions.push_back(std::move(fun));
    }

    if (!mainFound) {
        throw InvalidFile("invalid binary file: main() not found");
    }

    if (pos != buffer.size()) {
        throw InvalidFile("invalid binary file: unused content");
    }

    return File{version, std::move(constants), std::move(start), std::move(functions)};
}